

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

int ps_alignment_free(ps_alignment_t *al)

{
  int iVar1;
  ps_alignment_t *al_local;
  
  if (al == (ps_alignment_t *)0x0) {
    al_local._4_4_ = 0;
  }
  else {
    iVar1 = al->refcount + -1;
    al->refcount = iVar1;
    if (iVar1 < 1) {
      dict2pid_free(al->d2p);
      ckd_free((al->word).seq);
      ckd_free((al->sseq).seq);
      ckd_free((al->state).seq);
      ckd_free(al);
      al_local._4_4_ = 0;
    }
    else {
      al_local._4_4_ = al->refcount;
    }
  }
  return al_local._4_4_;
}

Assistant:

int
ps_alignment_free(ps_alignment_t *al)
{
    if (al == NULL)
        return 0;
    if (--al->refcount > 0)
        return al->refcount;
    dict2pid_free(al->d2p);
    ckd_free(al->word.seq);
    ckd_free(al->sseq.seq);
    ckd_free(al->state.seq);
    ckd_free(al);
    return 0;
}